

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreImporter.cpp
# Opt level: O3

void __thiscall
Assimp::Ogre::OgreImporter::InternReadFile
          (OgreImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer pcVar1;
  aiScene *paVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  Mesh *mesh_00;
  CIrrXML_IOStreamReader *this_00;
  IrrXMLReader *reader_00;
  MeshXml *mesh_01;
  runtime_error *this_01;
  unique_ptr<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_> mesh;
  MemoryStreamReader reader;
  _Head_base<0UL,_Assimp::Ogre::Mesh_*,_false> local_80;
  undefined1 local_78 [56];
  CIrrXML_IOStreamReader *local_40;
  aiScene *local_38;
  IOStream *_stream;
  
  pcVar1 = local_78 + 0x10;
  local_78._0_8_ = pcVar1;
  local_38 = pScene;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"rb","");
  iVar4 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_78._0_8_);
  _stream = (IOStream *)CONCAT44(extraout_var,iVar4);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if (_stream != (IOStream *)0x0) {
    local_78._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,".mesh","");
    bVar3 = EndsWith(pFile,(string *)local_78,false);
    if ((pointer)local_78._0_8_ != pcVar1) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    if (bVar3) {
      StreamReader<false,_false>::StreamReader((StreamReader<false,_false> *)local_78,_stream,false)
      ;
      mesh_00 = OgreBinarySerializer::ImportMesh((StreamReader<false,_false> *)local_78);
      local_80._M_head_impl = mesh_00;
      OgreBinarySerializer::ImportSkeleton(pIOHandler,mesh_00);
      paVar2 = local_38;
      ReadMaterials(this,pFile,pIOHandler,local_38,mesh_00);
      Mesh::ConvertToAssimpScene(local_80._M_head_impl,paVar2);
      std::unique_ptr<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_>::~unique_ptr
                ((unique_ptr<Assimp::Ogre::Mesh,_std::default_delete<Assimp::Ogre::Mesh>_> *)
                 &local_80);
      StreamReader<false,_false>::~StreamReader((StreamReader<false,_false> *)local_78);
    }
    else {
      this_00 = (CIrrXML_IOStreamReader *)operator_new(0x30);
      CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_00,_stream);
      local_40 = this_00;
      reader_00 = irr::io::createIrrXMLReader((IFileReadCallBack *)this_00);
      mesh_01 = OgreXmlSerializer::ImportMesh(reader_00);
      local_78._0_8_ = mesh_01;
      OgreXmlSerializer::ImportSkeleton(pIOHandler,mesh_01);
      paVar2 = local_38;
      ReadMaterials(this,pFile,pIOHandler,local_38,mesh_01);
      MeshXml::ConvertToAssimpScene((MeshXml *)local_78._0_8_,paVar2);
      std::unique_ptr<Assimp::Ogre::MeshXml,_std::default_delete<Assimp::Ogre::MeshXml>_>::
      ~unique_ptr((unique_ptr<Assimp::Ogre::MeshXml,_std::default_delete<Assimp::Ogre::MeshXml>_> *)
                  local_78);
      if (reader_00 != (IrrXMLReader *)0x0) {
        (*reader_00->_vptr_IIrrXMLReader[1])(reader_00);
      }
      (*(local_40->super_IFileReadCallBack)._vptr_IFileReadCallBack[1])();
      (*_stream->_vptr_IOStream[1])();
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 "Failed to open file ",pFile);
  std::runtime_error::runtime_error(this_01,(string *)local_78);
  *(undefined ***)this_01 = &PTR__runtime_error_007da4b8;
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreImporter::InternReadFile(const std::string &pFile, aiScene *pScene, Assimp::IOSystem *pIOHandler)
{
    // Open source file
    IOStream *f = pIOHandler->Open(pFile, "rb");
    if (!f) {
        throw DeadlyImportError("Failed to open file " + pFile);
    }

    // Binary .mesh import
    if (EndsWith(pFile, ".mesh", false))
    {
        /// @note MemoryStreamReader takes ownership of f.
        MemoryStreamReader reader(f);

        // Import mesh
        std::unique_ptr<Mesh> mesh(OgreBinarySerializer::ImportMesh(&reader));

        // Import skeleton
        OgreBinarySerializer::ImportSkeleton(pIOHandler, mesh.get());

        // Import mesh referenced materials
        ReadMaterials(pFile, pIOHandler, pScene, mesh.get());

        // Convert to Assimp
        mesh->ConvertToAssimpScene(pScene);
    }
    // XML .mesh.xml import
    else
    {
        /// @note XmlReader does not take ownership of f, hence the scoped ptr.
        std::unique_ptr<IOStream> scopedFile(f);
        std::unique_ptr<CIrrXML_IOStreamReader> xmlStream(new CIrrXML_IOStreamReader(scopedFile.get()));
        std::unique_ptr<XmlReader> reader(irr::io::createIrrXMLReader(xmlStream.get()));

        // Import mesh
        std::unique_ptr<MeshXml> mesh(OgreXmlSerializer::ImportMesh(reader.get()));

        // Import skeleton
        OgreXmlSerializer::ImportSkeleton(pIOHandler, mesh.get());

        // Import mesh referenced materials
        ReadMaterials(pFile, pIOHandler, pScene, mesh.get());

        // Convert to Assimp
        mesh->ConvertToAssimpScene(pScene);
    }
}